

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O0

void Gia_ManBmcAddCone_rec(Bmc_Mna_t *p,Gia_Obj_t *pObj)

{
  int i;
  int iVar1;
  Gia_Obj_t *pGVar2;
  int iObj;
  Gia_Obj_t *pObj_local;
  Bmc_Mna_t *p_local;
  
  if ((*(ulong *)pObj >> 0x1e & 1) == 0) {
    *(ulong *)pObj = *(ulong *)pObj & 0xffffffffbfffffff | 0x40000000;
    i = Gia_ObjId(p->pFrames,pObj);
    iVar1 = Gia_ObjIsAnd(pObj);
    if ((iVar1 == 0) || (iVar1 = Vec_IntEntry(p->vId2Var,i), iVar1 != 0)) {
      Vec_IntPush(p->vInputs,i);
    }
    else {
      pGVar2 = Gia_ObjFanin0(pObj);
      Gia_ManBmcAddCone_rec(p,pGVar2);
      pGVar2 = Gia_ObjFanin1(pObj);
      Gia_ManBmcAddCone_rec(p,pGVar2);
      Vec_IntPush(p->vNodes,i);
    }
  }
  return;
}

Assistant:

void Gia_ManBmcAddCone_rec( Bmc_Mna_t * p, Gia_Obj_t * pObj )
{
    int iObj;
    if ( pObj->fMark0 )
        return;
    pObj->fMark0 = 1;
    iObj = Gia_ObjId( p->pFrames, pObj );
    if ( Gia_ObjIsAnd(pObj) && Vec_IntEntry(p->vId2Var, iObj) == 0 )
    {
        Gia_ManBmcAddCone_rec( p, Gia_ObjFanin0(pObj) );
        Gia_ManBmcAddCone_rec( p, Gia_ObjFanin1(pObj) );
        Vec_IntPush( p->vNodes, iObj );
    }
    else
        Vec_IntPush( p->vInputs, iObj );
}